

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildFunction(ObjectModelBuilder *this,string *functionString,Class *clazz)

{
  size_type *psVar1;
  ostream *poVar2;
  undefined1 local_70 [8];
  Function f;
  string function;
  
  string_trim((string *)((long)&f.signature.field_2 + 8),functionString);
  psVar1 = &f.signature._M_string_length;
  f.signature._M_dataplus._M_p = (pointer)0x0;
  f.signature._M_string_length._0_1_ = 0;
  local_70 = (undefined1  [8])clazz;
  f.clazz = (Class *)psVar1;
  std::__cxx11::string::_M_assign((string *)&f);
  std::vector<Function,_std::allocator<Function>_>::push_back
            (&clazz->functions,(value_type *)local_70);
  if (this->m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," - function: \'",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)f.signature.field_2._8_8_,
                        (long)function._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (f.clazz != (Class *)psVar1) {
    operator_delete(f.clazz);
  }
  if ((size_type *)f.signature.field_2._8_8_ != &function._M_string_length) {
    operator_delete((void *)f.signature.field_2._8_8_);
  }
  return true;
}

Assistant:

bool ObjectModelBuilder::buildFunction(const std::string &functionString, Class *clazz)
{
    std::string function = string_trim(functionString);

    Function f;
    f.clazz = clazz;
    f.signature = function;
    clazz->functions.push_back(f);

    if (m_verbose)
        std::cerr << " - function: '" << function << "'" << std::endl;

    return true;
}